

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x89c360;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x89c450;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x89c388;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x89c3b0;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x89c3d8;
  this[-1].CapacityByWeight.ptr = 4.46072504256745e-317;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x89c428;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this_00,&PTR_construction_vtable_24__0089c468);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}